

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O1

PAL_ERROR CorUnix::CreateThreadObject(CPalThread *pThread,CPalThread *pNewThread,HANDLE *phThread)

{
  IPalObject *pIVar1;
  bool bVar2;
  PAL_ERROR PVar3;
  CObjectAttributes oa;
  IDataLock *pDataLock;
  CThreadProcessLocalData *pLocalData;
  HANDLE hThread;
  IPalObject *pobjRegisteredThread;
  IPalObject *pobjThread;
  
  pobjRegisteredThread = (IPalObject *)0x0;
  pLocalData = (CThreadProcessLocalData *)0x0;
  pDataLock = (IDataLock *)0x0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  oa.sObjectName.m_dwStringLength = 0;
  oa.sObjectName.m_dwMaxLength = 0;
  hThread = (HANDLE)0x0;
  PVar3 = (**(code **)*g_pObjectManager)(g_pObjectManager,pThread,&otThread);
  bVar2 = true;
  if ((PVar3 == 0) &&
     (PVar3 = (*pobjRegisteredThread->_vptr_IPalObject[3])
                        (pobjRegisteredThread,pThread,1,&oa.pSecurityAttributes,&pDataLock),
     PVar3 == 0)) {
    pDataLock->_vptr_IDataLock = (_func_int **)pNewThread;
    (*(code *)**(undefined8 **)oa.pSecurityAttributes)(oa.pSecurityAttributes,pThread,1);
    bVar2 = false;
    PVar3 = (**(code **)(*g_pObjectManager + 8))
                      (g_pObjectManager,pThread,pobjRegisteredThread,&aotThread,0,&pLocalData,
                       &hThread);
    pobjRegisteredThread = (IPalObject *)0x0;
    if (PVar3 == 0) {
      pNewThread->m_pThreadObject = (IPalObject *)hThread;
      (**(code **)(*hThread + 0x38))();
      *phThread = pLocalData;
      bVar2 = false;
    }
  }
  if (PVar3 != 0) {
    if (pLocalData != (CThreadProcessLocalData *)0x0) {
      (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread);
    }
    pIVar1 = pNewThread->m_pThreadObject;
    if (pIVar1 != (IPalObject *)0x0) {
      (*pIVar1->_vptr_IPalObject[8])(pIVar1,pThread);
    }
    if (bVar2) {
      CPalThread::ReleaseThreadReference(pNewThread);
    }
  }
  if (pobjRegisteredThread != (IPalObject *)0x0) {
    (*pobjRegisteredThread->_vptr_IPalObject[8])(pobjRegisteredThread,pThread);
  }
  if (hThread != (HANDLE)0x0) {
    (**(code **)(*hThread + 0x40))(hThread,pThread);
  }
  return PVar3;
}

Assistant:

PAL_ERROR
CorUnix::CreateThreadObject(
    CPalThread *pThread,
    CPalThread *pNewThread,
    HANDLE *phThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjThread = NULL;
    IDataLock *pDataLock;
    HANDLE hThread = NULL;
    CThreadProcessLocalData *pLocalData = NULL;
    CObjectAttributes oa;
    BOOL fThreadDataStoredInObject = FALSE;
    IPalObject *pobjRegisteredThread = NULL;

    //
    // Create the IPalObject for the thread
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otThread,
        &oa,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        goto CreateThreadObjectExit;
    }

    //
    // Store the CPalThread inside of the IPalObject
    //

    palError = pobjThread->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto CreateThreadObjectExit;
    }

    pLocalData->pThread = pNewThread;
    pDataLock->ReleaseLock(pThread, TRUE);
    fThreadDataStoredInObject = TRUE;

    //
    // Register the IPalObject (obtaining a handle)
    //

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjThread,
        &aotThread,
        0, //THREAD_ALL_ACCESS,
        &hThread,
        &pobjRegisteredThread
        );

    //
    // pobjThread is invalidated by the call to RegisterObject, so NULL
    // it out here to prevent it from being released
    //

    pobjThread = NULL;

    if (NO_ERROR != palError)
    {
        goto CreateThreadObjectExit;
    }

    //
    // Store the registered object inside of the thread object,
    // adding a reference for the thread itself
    //

    pNewThread->m_pThreadObject = pobjRegisteredThread;
    pNewThread->m_pThreadObject->AddReference();

    *phThread = hThread;

CreateThreadObjectExit:

    if (NO_ERROR != palError)
    {
        if (NULL != hThread)
        {
            g_pObjectManager->RevokeHandle(pThread, hThread);
        }

        if (NULL != pNewThread->m_pThreadObject)
        {
            //
            // Release the new thread's reference on the underlying thread
            // object
            //

            pNewThread->m_pThreadObject->ReleaseReference(pThread);
        }

        if (!fThreadDataStoredInObject)
        {
            //
            // The CPalThread for the new thread was never stored in
            // an IPalObject instance, so we need to release the initial
            // reference here. (If it has been stored it will get freed in
            // the owning object's cleanup routine)
            //

            pNewThread->ReleaseThreadReference();
        }
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    if (NULL != pobjRegisteredThread)
    {
        pobjRegisteredThread->ReleaseReference(pThread);
    }

    return palError;
}